

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pagerFixMaplimit(Pager *pPager)

{
  bool local_21;
  sqlite3_int64 local_20;
  sqlite3_int64 sz;
  sqlite3_file *fd;
  Pager *pPager_local;
  
  sz = (sqlite3_int64)pPager->fd;
  if (((sqlite3_file *)sz)->pMethods != (sqlite3_io_methods *)0x0) {
    local_21 = false;
    if (2 < ((sqlite3_file *)sz)->pMethods->iVersion) {
      local_21 = 0 < pPager->szMmap;
    }
    pPager->bUseFetch = local_21;
    local_20 = pPager->szMmap;
    fd = (sqlite3_file *)pPager;
    sqlite3OsFileControlHint(pPager->fd,0x12,&local_20);
  }
  return;
}

Assistant:

static void pagerFixMaplimit(Pager *pPager){
#if SQLITE_MAX_MMAP_SIZE>0
  sqlite3_file *fd = pPager->fd;
  if( isOpen(fd) ){
    sqlite3_int64 sz;
    pPager->bUseFetch = (fd->pMethods->iVersion>=3) && pPager->szMmap>0;
    sz = pPager->szMmap;
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_MMAP_SIZE, &sz);
  }
#endif
}